

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O0

size_t arith_compress(uint8_t *obuff,size_t osize,uint32_t *ibuff,size_t isize)

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  reference pvVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  size_t sVar10;
  long in_RDI;
  int i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> F;
  size_t nunq;
  size_t maxv;
  size_t op;
  int first;
  uint32_t num_ff_bytes;
  uint8_t byte;
  uint8_t last_non_ff_byte;
  uint32_t v;
  uint64_t scale;
  uint64_t total;
  uint64_t high;
  uint64_t low;
  uint64_t R;
  uint64_t L;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff30;
  int silent;
  size_t in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint32_t *local_b8;
  size_type local_b0;
  size_type local_98;
  size_t *in_stack_ffffffffffffff78;
  pointer in_stack_ffffffffffffff80;
  uint64_t uVar11;
  ulong local_70;
  long lVar12;
  int iVar13;
  int iVar14;
  undefined2 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaa;
  char cVar15;
  undefined4 in_stack_ffffffffffffffac;
  uint8_t *in_stack_ffffffffffffffb0;
  ulong local_30;
  ulong isize_00;
  
  isize_00 = 0;
  local_30 = 0xffffffffffffff;
  cVar15 = '\0';
  iVar14 = 0;
  iVar13 = 1;
  lVar12 = 0;
  uVar11 = 0;
  count_freqs((uint32_t *)0x0,(size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  for (local_98 = 0; silent = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20), local_98 <= local_70;
      local_98 = local_98 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffff70,local_98);
    uVar11 = (*pvVar6 != 0) + uVar11;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffff70,local_98);
    *pvVar6 = *pvVar6 + 1;
  }
  sVar7 = byte_encode((uint8_t *)(in_RDI + lVar12),(long)in_RSI - lVar12,local_70,0x80000000);
  lVar12 = sVar7 + lVar12;
  sVar7 = byte_encode((uint8_t *)(in_RDI + lVar12),(long)in_RSI - lVar12,uVar11,0x80000000);
  sVar7 = sVar7 + lVar12;
  if (uVar11 < 1000) {
    silent = (int)((long)in_RSI - sVar7 >> 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17a0bd);
    in_stack_ffffffffffffff38 =
         interp_compress(in_stack_ffffffffffffffb0,
                         CONCAT44(in_stack_ffffffffffffffac,
                                  CONCAT13(cVar15,CONCAT12(in_stack_ffffffffffffffaa,
                                                           in_stack_ffffffffffffffa8))),
                         (uint32_t *)CONCAT44(iVar14,iVar13),sVar7);
    sVar7 = in_stack_ffffffffffffff38 + sVar7;
  }
  else {
    in_stack_ffffffffffffff10 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + sVar7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17a14a);
    sVar10 = arith_compress(in_RSI,in_RDX,in_RCX,isize_00);
    sVar7 = sVar10 + sVar7;
  }
  uVar11 = scale_counts((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff38,silent);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &stack0xffffffffffffff70,0);
  *pvVar6 = 0;
  for (local_b0 = 1; local_b0 <= local_70; local_b0 = local_b0 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffff70,local_b0 - 1);
    vVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffff70,local_b0);
    vVar2 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffff70,local_b0);
    *pvVar6 = vVar1 + vVar2;
  }
  for (local_b8 = (uint32_t *)0x0; local_b8 < in_RCX; local_b8 = (uint32_t *)((long)local_b8 + 1)) {
    uVar3 = *(uint *)(in_RDX + (long)local_b8 * 4);
    uVar5 = uVar3 + 1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffff70,(ulong)uVar3);
    uVar8 = (ulong)*pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffff70,(ulong)uVar5);
    uVar9 = local_30 >> 0x1f;
    isize_00 = uVar8 * uVar9 + isize_00;
    if (*pvVar6 < uVar11) {
      local_30 = (*pvVar6 - uVar8) * uVar9;
    }
    else {
      local_30 = local_30 - uVar8 * uVar9;
    }
    if (0xffffffffffffff < isize_00) {
      cVar15 = cVar15 + '\x01';
      isize_00 = isize_00 & 0xffffffffffffff;
      for (; iVar14 != 0; iVar14 = iVar14 + -1) {
        *(char *)(in_RDI + sVar7) = cVar15;
        cVar15 = '\0';
        sVar7 = sVar7 + 1;
      }
    }
    for (; local_30 < 0x1000000000000; local_30 = local_30 << 8) {
      cVar4 = (char)(isize_00 >> 0x30);
      if (cVar4 == -1) {
        iVar14 = iVar14 + 1;
      }
      else {
        sVar10 = sVar7;
        if (iVar13 == 0) {
          sVar10 = sVar7 + 1;
          *(char *)(in_RDI + sVar7) = cVar15;
        }
        for (; iVar14 != 0; iVar14 = iVar14 + -1) {
          *(undefined1 *)(in_RDI + sVar10) = 0xff;
          sVar10 = sVar10 + 1;
        }
        iVar13 = 0;
        sVar7 = sVar10;
        cVar15 = cVar4;
      }
      isize_00 = (isize_00 & 0xffffffffffff) << 8;
    }
  }
  sVar10 = sVar7;
  if (iVar13 == 0) {
    sVar10 = sVar7 + 1;
    *(char *)(in_RDI + sVar7) = cVar15;
  }
  for (; iVar14 != 0; iVar14 = iVar14 + -1) {
    *(undefined1 *)(in_RDI + sVar10) = 0xff;
    sVar10 = sVar10 + 1;
  }
  for (iVar14 = 6; -1 < iVar14; iVar14 = iVar14 + -1) {
    *(char *)(in_RDI + sVar10) = (char)(isize_00 >> ((byte)(iVar14 << 3) & 0x3f));
    sVar10 = sVar10 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff10);
  return sVar10;
}

Assistant:

size_t arith_compress(uint8_t* obuff, /* output buffer */
    size_t osize, /* output buffer size */
    const uint32_t* ibuff, /* input buffer */
    size_t isize)
{ /* input buffer size */

    /* returns the number of bytes written to the output buffer,
           fails/exits if output buffer is too small, provided that
           //myassertion() in enabled */

    /* state variables for encoding */
    uint64_t L = ZERO;
    uint64_t R = FULL;
    uint64_t low, high, total, scale;
    uint32_t v;
    uint8_t last_non_ff_byte = 0, byte;
    uint32_t num_ff_bytes = 0;

    int first = 1;
    size_t op = 0;
    size_t maxv, nunq = 0;

    /* count the frequencies of the provided symbols */
    auto F = count_freqs(ibuff, isize, &maxv);

    /* adjust the counts to allow the interpolative encoder to work */
    for (size_t i = 0; i <= maxv; i++) {
        nunq += (F[i] > 0);
        F[i]++;
    }

    /* now code the prelude into the output buffer */
    op += byte_encode(obuff + op, osize - op, maxv, (1LL << 31));
    op += byte_encode(obuff + op, osize - op, nunq, (1LL << 31));

    if (nunq < PREL_RECURSE) {
        /* small enough that inefficient approach is ok */
        op += interp_compress(obuff + op, osize - op, F.data(), maxv + 1);
    } else {
        /* or else, ta-daa, recursive call for prelude... */
        op += arith_compress(obuff + op, osize - op, F.data(), maxv + 1);
    }

    /* and now scale them up to get total to be a power of two */
    total = scale_counts(F, maxv, 0);

    /* bit ugly to have this next output line coming from here,
           but will do for now */
    /* and turn the adjusted counts in F into cumulative array */
    F[0] = 0;
    for (size_t i = 1; i <= maxv; i++) {
        F[i] = F[i - 1] + F[i];
    }

    /* now encode the array of symbols using the fixed array F to
           control probability estimation, one at a time */
    for (size_t i = 0; i < isize; i++) {
        v = ibuff[i] + 1;

        /* allocated probability range for this symbol */
        low = F[v - 1];
        high = F[v];

        /* this is the actual arithmetic coding step */
        scale = R >> TBTS;
        L += low * scale;
        if (high < total) {
            /* top symbol gets beneit of rounding gaps */
            R = (high - low) * scale;
        } else {
            R = R - low * scale;
        }

        /* now sort out the carry/renormalization process */
        if (L > FULL) {
            /* lower bound has overflowed, need first to push
                           a carry through the ff bytes and into the pending
                           non-ff byte */
            last_non_ff_byte += 1;
            L &= FULL;
            while (num_ff_bytes > 0) {
                obuff[op++] = last_non_ff_byte;
                num_ff_bytes--;
                last_non_ff_byte = ZERO;
            }
        }

        /* more normal type of renorm step */
        while (R < PART) {
            /* can output (or rather, save for later output)
                           a byte from the front of L */
            byte = (L >> (BBITS - 8));
            if (byte != FULLBYTE) {
                /* not ff, so can bring everything up to date */
                if (!first) {
                    obuff[op++] = last_non_ff_byte;
                }
                while (num_ff_bytes) {
                    obuff[op++] = FULLBYTE;
                    num_ff_bytes--;
                }
                last_non_ff_byte = byte;
                first = 0;
            } else {
                /* ff bytes just get counted */
                num_ff_bytes++;
            }
            L <<= 8;
            L &= FULL;
            R <<= 8;
        }
    }

    /* wind up: first flush all of the pending bytes */
    if (!first) {
        obuff[op++] = last_non_ff_byte;
    }
    while (num_ff_bytes) {
        obuff[op++] = FULLBYTE;
        num_ff_bytes--;
    }

    /* then send the final bytes from L, to be sure to be sure */
    for (int i = BBYTES - 1; i >= 0; i--) {
        obuff[op++] = (L >> ((8 * i))) & FULLBYTE;
    }

    /* tidy up, and done */
    return op;
}